

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_dfg.c
# Opt level: O2

void queue_master_msg(EVmaster master,void *vmsg,EVmaster_msg_type msg_type,CMConnection conn,
                     int copy)

{
  int iVar1;
  long lVar2;
  _EVmaster_msg *p_Var3;
  CManager_conflict cm;
  char *pcVar4;
  _EVmaster_msg *p_Var5;
  EVattr_stone_struct *pEVar6;
  char *pcVar7;
  leaf_element *plVar8;
  EVmaster_msg_ptr *pp_Var9;
  EVmaster_msg_ptr p_Var10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  EVflush_attrs_reconfig_ptr in;
  bool bVar15;
  
  p_Var5 = (_EVmaster_msg *)INT_CMmalloc(0x40);
  p_Var5->msg_type = msg_type;
  p_Var5->conn = conn;
  switch(msg_type) {
  case DFGnode_join:
    if (copy == 0) {
      (p_Var5->u).node_join.sources = *(leaf_element **)((long)vmsg + 0x20);
      pcVar7 = *vmsg;
      pcVar4 = *(char **)((long)vmsg + 8);
      plVar8 = *(leaf_element **)((long)vmsg + 0x18);
      (p_Var5->u).flush_reconfig.attr_stone_list = *(EVattr_stone_struct **)((long)vmsg + 0x10);
      (p_Var5->u).node_join.sinks = plVar8;
      (p_Var5->u).node_join.node_name = pcVar7;
      (p_Var5->u).node_join.contact_string = pcVar4;
    }
    else {
      pcVar7 = strdup(*vmsg);
      (p_Var5->u).node_join.node_name = pcVar7;
      pcVar7 = strdup(*(char **)((long)vmsg + 8));
      (p_Var5->u).node_join.contact_string = pcVar7;
      (p_Var5->u).node_join.source_count = *(int *)((long)vmsg + 0x10);
      iVar1 = *(int *)((long)vmsg + 0x14);
      (p_Var5->u).node_join.sink_count = iVar1;
      plVar8 = (leaf_element *)INT_CMmalloc((long)iVar1 << 4);
      (p_Var5->u).node_join.sinks = plVar8;
      uVar14 = 0;
      uVar12 = (ulong)*(uint *)((long)vmsg + 0x14);
      if ((int)*(uint *)((long)vmsg + 0x14) < 1) {
        uVar12 = uVar14;
      }
      for (; uVar12 * 0x10 != uVar14; uVar14 = uVar14 + 0x10) {
        lVar11 = *(long *)((long)vmsg + 0x18);
        pcVar7 = *(char **)(lVar11 + uVar14);
        if (pcVar7 == (char *)0x0) {
          pcVar7 = (char *)0x0;
        }
        else {
          pcVar7 = strdup(pcVar7);
        }
        *(char **)((long)&((p_Var5->u).node_join.sinks)->name + uVar14) = pcVar7;
        pcVar7 = *(char **)(lVar11 + 8 + uVar14);
        if (pcVar7 == (char *)0x0) {
          pcVar7 = (char *)0x0;
        }
        else {
          pcVar7 = strdup(pcVar7);
        }
        *(char **)((long)&((p_Var5->u).node_join.sinks)->FMtype + uVar14) = pcVar7;
      }
      plVar8 = (leaf_element *)INT_CMmalloc((long)*(int *)((long)vmsg + 0x10) << 4);
      (p_Var5->u).node_join.sources = plVar8;
      uVar14 = 0;
      uVar12 = (ulong)*(uint *)((long)vmsg + 0x10);
      if ((int)*(uint *)((long)vmsg + 0x10) < 1) {
        uVar12 = uVar14;
      }
      for (; uVar12 * 0x10 != uVar14; uVar14 = uVar14 + 0x10) {
        lVar11 = *(long *)((long)vmsg + 0x20);
        pcVar7 = *(char **)(lVar11 + uVar14);
        if (pcVar7 == (char *)0x0) {
          pcVar7 = (char *)0x0;
        }
        else {
          pcVar7 = strdup(pcVar7);
        }
        *(char **)((long)&((p_Var5->u).node_join.sources)->name + uVar14) = pcVar7;
        pcVar7 = *(char **)(lVar11 + 8 + uVar14);
        if (pcVar7 == (char *)0x0) {
          pcVar7 = (char *)0x0;
        }
        else {
          pcVar7 = strdup(pcVar7);
        }
        *(char **)((long)&((p_Var5->u).node_join.sources)->FMtype + uVar14) = pcVar7;
      }
    }
    break;
  case DFGdeploy_ack:
    (p_Var5->u).node_join.node_name = *vmsg;
    break;
  case DFGshutdown_contrib:
  case DFGconn_shutdown:
    (p_Var5->u).shutdown_contrib.value = *vmsg;
    break;
  case DFGflush_reconfig:
    (p_Var5->u).flush_reconfig.attr_stone_list = *(EVattr_stone_struct **)((long)vmsg + 0x10);
    pcVar7 = *(char **)((long)vmsg + 8);
    (p_Var5->u).node_join.node_name = *vmsg;
    (p_Var5->u).node_join.contact_string = pcVar7;
    if (copy != 0) {
      pEVar6 = (EVattr_stone_struct *)INT_CMmalloc(*(long *)((long)vmsg + 8) << 4);
      (p_Var5->u).flush_reconfig.attr_stone_list = pEVar6;
      lVar13 = 0;
      lVar11 = *(long *)((long)vmsg + 8);
      if (*(long *)((long)vmsg + 8) < 1) {
        lVar11 = lVar13;
      }
      while (bVar15 = lVar11 != 0, lVar11 = lVar11 + -1, bVar15) {
        lVar2 = *(long *)((long)vmsg + 0x10);
        *(undefined8 *)((long)&((p_Var5->u).flush_reconfig.attr_stone_list)->stone + lVar13) =
             *(undefined8 *)(lVar2 + lVar13);
        pcVar7 = strdup(*(char **)(lVar2 + 8 + lVar13));
        *(char **)((long)&((p_Var5->u).flush_reconfig.attr_stone_list)->attr_str + lVar13) = pcVar7;
        lVar13 = lVar13 + 0x10;
      }
    }
    break;
  default:
    printf("MEssage type bad, value is %d  %d\n",(ulong)msg_type,(ulong)msg_type);
    __assert_fail("FALSE",
                  "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/ev_dfg.c"
                  ,0x995,
                  "void queue_master_msg(EVmaster, void *, EVmaster_msg_type, CMConnection, int)");
  }
  p_Var5->next = (_EVmaster_msg *)0x0;
  p_Var3 = master->queued_messages;
  if (master->queued_messages == (EVmaster_msg_ptr)0x0) {
    pp_Var9 = &master->queued_messages;
  }
  else {
    do {
      p_Var10 = p_Var3;
      p_Var3 = p_Var10->next;
    } while (p_Var3 != (_EVmaster_msg *)0x0);
    pp_Var9 = &p_Var10->next;
  }
  *pp_Var9 = p_Var5;
  cm = master->cm;
  if (cm->control_list->server_thread == 0) {
    handle_queued_messages(cm,master);
    return;
  }
  CMwake_server_thread(cm);
  return;
}

Assistant:

static void
queue_master_msg(EVmaster master, void*vmsg, EVmaster_msg_type msg_type, CMConnection conn, int copy)
{
    EVmaster_msg_ptr msg = malloc(sizeof(EVmaster_msg));
    msg->msg_type = msg_type;
    msg->conn = conn;
    switch(msg_type) {
    case DFGnode_join: {
	EVnode_join_ptr in = (EVnode_join_ptr)vmsg;
	if (!copy) {
	    msg->u.node_join = *in;
	} else {
	    int i;
	    msg->u.node_join.node_name = strdup(in->node_name);
	    msg->u.node_join.contact_string = strdup(in->contact_string);
	    msg->u.node_join.source_count = in->source_count;
	    msg->u.node_join.sink_count = in->sink_count;
	    msg->u.node_join.sinks = (leaf_element*)malloc(sizeof(leaf_element) * in->sink_count);
	    for (i=0; i < in->sink_count; i++) {
		leaf_element *l = &in->sinks[i];
		msg->u.node_join.sinks[i].name = l->name ? strdup(l->name) : NULL;
		msg->u.node_join.sinks[i].FMtype = l->FMtype ? strdup(l->FMtype) : NULL;
	    }
	    msg->u.node_join.sources = (leaf_element*)malloc(sizeof(leaf_element) * in->source_count);
	    for (i=0; i < in->source_count; i++) {
		leaf_element *l = &in->sources[i];
		msg->u.node_join.sources[i].name = l->name ? strdup(l->name) : NULL;
		msg->u.node_join.sources[i].FMtype = l->FMtype ? strdup(l->FMtype) : NULL;
	    }
	}
	break;
    }
    case DFGdeploy_ack: {
	EVdeploy_ack_ptr in = (EVdeploy_ack_ptr)vmsg;
	msg->u.deploy_ack = *in;
	break;
    }
    case DFGshutdown_contrib: {
	EVshutdown_contribution_ptr in = (EVshutdown_contribution_ptr)vmsg;
	msg->u.shutdown_contrib = *in;
	break;
    }
    case  DFGconn_shutdown: {
	EVconn_shutdown_ptr in = (EVconn_shutdown_ptr)vmsg;
	msg->u.conn_shutdown = *in;
	break;
    }
    case DFGflush_reconfig: {
	EVflush_attrs_reconfig_ptr in = (EVflush_attrs_reconfig_ptr)vmsg;
	msg->u.flush_reconfig = *in;
	if (copy) {
	    int i;
	    msg->u.flush_reconfig.attr_stone_list = malloc(sizeof(EVattr_stone_struct) * in->count);
	    for (i=0 ; i < in->count; i++) {
		msg->u.flush_reconfig.attr_stone_list[i].stone = in->attr_stone_list[i].stone;
		msg->u.flush_reconfig.attr_stone_list[i].attr_str = strdup(in->attr_stone_list[i].attr_str);
	    }
	}
	break;
    }
    default:
	printf("MEssage type bad, value is %d  %d\n", msg_type, msg->msg_type);
	assert(FALSE);
    }
    msg->next = NULL;
    if (master->queued_messages == NULL) {
	master->queued_messages = msg;
    } else {
	EVmaster_msg_ptr last = master->queued_messages;
	while (last->next != NULL) last = last->next;
	last->next = msg;
    }
    if (master->cm->control_list->server_thread != 0) {
	CMwake_server_thread(master->cm);
    } else {
	handle_queued_messages(master->cm, master);
    }
}